

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

pointer __thiscall
QList<std::pair<double,_QVariant>_>::data(QList<std::pair<double,_QVariant>_> *this)

{
  Data *pDVar1;
  
  pDVar1 = (this->d).d;
  if ((pDVar1 == (Data *)0x0) ||
     (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QArrayDataPointer<std::pair<double,_QVariant>_>::reallocateAndGrow
              (&this->d,GrowsAtEnd,0,(QArrayDataPointer<std::pair<double,_QVariant>_> *)0x0);
  }
  return (this->d).ptr;
}

Assistant:

pointer data() { detach(); return d->data(); }